

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_y_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  
  if (0 < h) {
    puVar2 = src + src_stride;
    iVar3 = 0;
    do {
      if (0 < w) {
        uVar1 = 0;
        do {
          dst[uVar1] = (uint8_t)((uint)src[uVar1] + (uint)puVar2[uVar1] + 1 >> 1);
          uVar1 = uVar1 + 1;
        } while ((uint)w != uVar1);
      }
      src = src + src_stride;
      dst = dst + dst_stride;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + src_stride;
    } while (iVar3 != h);
  }
  return;
}

Assistant:

void av1_convolve_y_sr_intrabc_c(const uint8_t *src, int src_stride,
                                 uint8_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_y,
                                 const int subpel_y_qn) {
  assert(subpel_y_qn == 8);
  assert(filter_params_y->taps == 2);
  (void)filter_params_y;
  (void)subpel_y_qn;

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[src_stride + x];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(res, 1));
    }
    src += src_stride;
    dst += dst_stride;
  }
}